

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::BinaryTranslatorOperator::convertToMessage
          (BinaryTranslatorOperator *this,SmallBuffer *value)

{
  SmallBuffer *this_00;
  _func_int *size;
  _func_int **__s;
  SmallBuffer *in_RDX;
  pointer *__ptr;
  
  __s = (_func_int **)operator_new(0x100);
  this_00 = (SmallBuffer *)(__s + 2);
  memset(__s,0,0xf8);
  __s[0xb] = (_func_int *)0x40;
  __s[0xc] = (_func_int *)this_00;
  __s[0xe] = (_func_int *)(__s + 0x10);
  __s[0x12] = (_func_int *)(__s + 0x14);
  __s[0x16] = (_func_int *)(__s + 0x18);
  __s[0x1a] = (_func_int *)(__s + 0x1c);
  __s[0x1f] = (_func_int *)0x0;
  (this->super_TranslatorOperator)._vptr_TranslatorOperator = __s;
  if (this_00 != in_RDX) {
    size = (_func_int *)in_RDX->bufferSize;
    SmallBuffer::reserve(this_00,(size_t)size);
    __s[10] = size;
    memcpy(__s[0xc],in_RDX->heap,in_RDX->bufferSize);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> BinaryTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    auto m = std::make_unique<Message>();
    m->data = value;
    return m;
}